

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

lostFraction __thiscall llvm::detail::IEEEFloat::divideSignificand(IEEEFloat *this,IEEEFloat *rhs)

{
  uint uVar1;
  WordType *parts;
  fltSemantics *pfVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  WordType *parts_00;
  ulong uVar6;
  uint uVar7;
  lostFraction lVar8;
  Significand *pSVar9;
  Significand *parts_01;
  uint n;
  integerPart scratch [4];
  WordType local_58 [5];
  
  pfVar2 = this->semantics;
  if (pfVar2 != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x439,
                  "lostFraction llvm::detail::IEEEFloat::divideSignificand(const IEEEFloat &)");
  }
  uVar7 = pfVar2->precision;
  if (uVar7 - 0x40 < 0xffffff80) {
    parts_01 = (Significand *)(this->significand).parts;
  }
  else {
    parts_01 = &this->significand;
  }
  if (rhs->semantics->precision - 0x40 < 0xffffff80) {
    pSVar9 = (Significand *)(rhs->significand).parts;
  }
  else {
    pSVar9 = &rhs->significand;
  }
  uVar1 = uVar7 + 0x40;
  n = uVar1 >> 6;
  if (uVar1 < 0xc0) {
    parts_00 = local_58;
  }
  else {
    parts_00 = (WordType *)operator_new__((ulong)(n << 4));
  }
  parts = parts_00 + n;
  if (uVar7 < 0xffffffc0) {
    uVar6 = 0;
    do {
      *(undefined8 *)((long)parts_00 + uVar6) = *(undefined8 *)((long)parts_01 + uVar6);
      *(undefined8 *)((long)parts_00 + uVar6 + n * 8) = *(undefined8 *)((long)pSVar9 + uVar6);
      *(undefined8 *)((long)parts_01 + uVar6) = 0;
      uVar6 = uVar6 + 8;
    } while (n * 8 != uVar6);
  }
  this->exponent = this->exponent - rhs->exponent;
  uVar7 = pfVar2->precision;
  uVar4 = APInt::tcMSB(parts,n);
  uVar4 = ~uVar4 + uVar7;
  if (uVar4 != 0) {
    this->exponent = this->exponent + (short)uVar4;
    APInt::tcShiftLeft(parts,n,uVar4);
  }
  uVar4 = APInt::tcMSB(parts_00,n);
  uVar4 = ~uVar4 + uVar7;
  if (uVar4 != 0) {
    this->exponent = this->exponent - (short)uVar4;
    APInt::tcShiftLeft(parts_00,n,uVar4);
  }
  iVar5 = APInt::tcCompare(parts_00,parts,n);
  if (iVar5 < 0) {
    this->exponent = this->exponent + -1;
    APInt::tcShiftLeft(parts_00,n,1);
    iVar5 = APInt::tcCompare(parts_00,parts,n);
    if (iVar5 < 0) {
      __assert_fail("APInt::tcCompare(dividend, divisor, partsCount) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x465,
                    "lostFraction llvm::detail::IEEEFloat::divideSignificand(const IEEEFloat &)");
    }
  }
  while (uVar7 != 0) {
    uVar7 = uVar7 - 1;
    iVar5 = APInt::tcCompare(parts_00,parts,n);
    if (-1 < iVar5) {
      APInt::tcSubtract(parts_00,parts,0,n);
      APInt::tcSetBit(&parts_01->part,uVar7);
    }
    APInt::tcShiftLeft(parts_00,n,1);
  }
  iVar5 = APInt::tcCompare(parts_00,parts,n);
  lVar8 = lfMoreThanHalf;
  if (iVar5 < 1) {
    if (iVar5 == 0) {
      lVar8 = lfExactlyHalf;
    }
    else {
      bVar3 = APInt::tcIsZero(parts_00,n);
      lVar8 = (lostFraction)!bVar3;
    }
  }
  if (0xbf < uVar1) {
    operator_delete__(parts_00);
  }
  return lVar8;
}

Assistant:

lostFraction IEEEFloat::divideSignificand(const IEEEFloat &rhs) {
  unsigned int bit, i, partsCount;
  const integerPart *rhsSignificand;
  integerPart *lhsSignificand, *dividend, *divisor;
  integerPart scratch[4];
  lostFraction lost_fraction;

  assert(semantics == rhs.semantics);

  lhsSignificand = significandParts();
  rhsSignificand = rhs.significandParts();
  partsCount = partCount();

  if (partsCount > 2)
    dividend = new integerPart[partsCount * 2];
  else
    dividend = scratch;

  divisor = dividend + partsCount;

  /* Copy the dividend and divisor as they will be modified in-place.  */
  for (i = 0; i < partsCount; i++) {
    dividend[i] = lhsSignificand[i];
    divisor[i] = rhsSignificand[i];
    lhsSignificand[i] = 0;
  }

  exponent -= rhs.exponent;

  unsigned int precision = semantics->precision;

  /* Normalize the divisor.  */
  bit = precision - APInt::tcMSB(divisor, partsCount) - 1;
  if (bit) {
    exponent += bit;
    APInt::tcShiftLeft(divisor, partsCount, bit);
  }

  /* Normalize the dividend.  */
  bit = precision - APInt::tcMSB(dividend, partsCount) - 1;
  if (bit) {
    exponent -= bit;
    APInt::tcShiftLeft(dividend, partsCount, bit);
  }

  /* Ensure the dividend >= divisor initially for the loop below.
     Incidentally, this means that the division loop below is
     guaranteed to set the integer bit to one.  */
  if (APInt::tcCompare(dividend, divisor, partsCount) < 0) {
    exponent--;
    APInt::tcShiftLeft(dividend, partsCount, 1);
    assert(APInt::tcCompare(dividend, divisor, partsCount) >= 0);
  }

  /* Long division.  */
  for (bit = precision; bit; bit -= 1) {
    if (APInt::tcCompare(dividend, divisor, partsCount) >= 0) {
      APInt::tcSubtract(dividend, divisor, 0, partsCount);
      APInt::tcSetBit(lhsSignificand, bit - 1);
    }

    APInt::tcShiftLeft(dividend, partsCount, 1);
  }

  /* Figure out the lost fraction.  */
  int cmp = APInt::tcCompare(dividend, divisor, partsCount);

  if (cmp > 0)
    lost_fraction = lfMoreThanHalf;
  else if (cmp == 0)
    lost_fraction = lfExactlyHalf;
  else if (APInt::tcIsZero(dividend, partsCount))
    lost_fraction = lfExactlyZero;
  else
    lost_fraction = lfLessThanHalf;

  if (partsCount > 2)
    delete [] dividend;

  return lost_fraction;
}